

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

ssize_t __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
::write(basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        *this,int __fd,void *__buf,size_t __n)

{
  type __result;
  wchar_t *pwVar1;
  undefined4 in_register_00000034;
  
  __result = internal::reserve<fmt::v5::internal::basic_buffer<wchar_t>>(&this->out_,(size_t)__buf);
  pwVar1 = std::__copy_move<false,false,std::random_access_iterator_tag>::
           __copy_m<char_const*,wchar_t*>
                     ((char *)CONCAT44(in_register_00000034,__fd),
                      (char *)((long)__buf + (long)CONCAT44(in_register_00000034,__fd)),__result);
  return (ssize_t)pwVar1;
}

Assistant:

void write(string_view value) {
    auto &&it = reserve(value.size());
    it = internal::copy_str<char_type>(value.begin(), value.end(), it);
  }